

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::setNextTargetMsgSeqNum(SessionState *this,SEQNUM n)

{
  Locker local_20;
  Locker l;
  SEQNUM n_local;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)n;
  Locker::Locker(&local_20,&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[7])(this->m_pStore,l.m_mutex);
  Locker::~Locker(&local_20);
  return;
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    m_pStore->setNextTargetMsgSeqNum(n);
  }